

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

void duckdb::RadixSortMSD
               (data_ptr_t orig_ptr,data_ptr_t temp_ptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *comp_width,idx_t *offset,idx_t *locations,bool swap)

{
  idx_t iVar1;
  idx_t iVar2;
  byte *pbVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  data_ptr_t row_ptr;
  data_ptr_t src;
  ulong uVar9;
  bool local_79;
  idx_t local_50;
  idx_t local_48;
  ulong *local_40;
  data_ptr_t local_38;
  
  local_79 = swap;
  local_38 = temp_ptr;
  src = orig_ptr;
  if (swap) {
    local_38 = orig_ptr;
    src = temp_ptr;
  }
  switchD_01043a80::default(locations,0,0x808);
  iVar1 = *offset;
  iVar2 = *col_offset;
  if (*count != 0) {
    pbVar3 = src + iVar1 + iVar2;
    uVar5 = 0;
    do {
      locations[(ulong)*pbVar3 + 1] = locations[(ulong)*pbVar3 + 1] + 1;
      pbVar3 = pbVar3 + *row_width;
      uVar5 = uVar5 + 1;
    } while (uVar5 < *count);
  }
  iVar4 = *locations;
  lVar6 = 1;
  uVar5 = 0;
  do {
    uVar7 = locations[lVar6];
    if (uVar5 <= uVar7) {
      uVar5 = uVar7;
    }
    iVar4 = iVar4 + uVar7;
    locations[lVar6] = iVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x101);
  uVar7 = uVar5;
  if (uVar5 != *count) {
    if (*count == 0) {
      uVar7 = 0;
    }
    else {
      uVar9 = 0;
      local_40 = locations;
      do {
        uVar7 = local_40[src[iVar1 + iVar2]];
        local_40[src[iVar1 + iVar2]] = uVar7 + 1;
        FastMemcpy(local_38 + uVar7 * *row_width,src,*row_width);
        src = src + *row_width;
        uVar9 = uVar9 + 1;
        uVar7 = *count;
        locations = local_40;
      } while (uVar9 < uVar7);
    }
    local_79 = !swap;
  }
  if (*offset == *comp_width - 1) {
    if (local_79 != false) {
      switchD_015de399::default(orig_ptr,temp_ptr,uVar7 * *row_width);
      return;
    }
  }
  else if (uVar5 == uVar7) {
    local_48 = *offset + 1;
    RadixSortMSD(orig_ptr,temp_ptr,count,col_offset,row_width,comp_width,&local_48,locations + 0x101
                 ,local_79);
  }
  else {
    local_48 = *locations;
    lVar6 = 0;
    uVar5 = local_48;
    do {
      lVar8 = (uVar5 - local_48) * *row_width;
      if (local_48 < 0x19) {
        if (local_48 != 0) {
          local_50 = *offset + 1;
          InsertionSort(orig_ptr + lVar8,temp_ptr + lVar8,&local_48,col_offset,row_width,comp_width,
                        &local_50,local_79);
        }
      }
      else {
        local_50 = *offset + 1;
        RadixSortMSD(orig_ptr + lVar8,temp_ptr + lVar8,&local_48,col_offset,row_width,comp_width,
                     &local_50,locations + 0x101,local_79);
      }
      uVar5 = locations[lVar6 + 1];
      local_48 = uVar5 - locations[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

void RadixSortMSD(const data_ptr_t orig_ptr, const data_ptr_t temp_ptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &comp_width, const idx_t &offset, idx_t locations[], bool swap) {
	const data_ptr_t source_ptr = swap ? temp_ptr : orig_ptr;
	const data_ptr_t target_ptr = swap ? orig_ptr : temp_ptr;
	// Init counts to 0
	memset(locations, 0, SortConstants::MSD_RADIX_LOCATIONS * sizeof(idx_t));
	idx_t *counts = locations + 1;
	// Collect counts
	const idx_t total_offset = col_offset + offset;
	data_ptr_t offset_ptr = source_ptr + total_offset;
	for (idx_t i = 0; i < count; i++) {
		counts[*offset_ptr]++;
		offset_ptr += row_width;
	}
	// Compute locations from counts
	idx_t max_count = 0;
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		max_count = MaxValue<idx_t>(max_count, counts[radix]);
		counts[radix] += locations[radix];
	}
	if (max_count != count) {
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr;
		for (idx_t i = 0; i < count; i++) {
			const idx_t &radix_offset = locations[*(row_ptr + total_offset)]++;
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr += row_width;
		}
		swap = !swap;
	}
	// Check if done
	if (offset == comp_width - 1) {
		if (swap) {
			memcpy(orig_ptr, temp_ptr, count * row_width);
		}
		return;
	}
	if (max_count == count) {
		RadixSortMSD(orig_ptr, temp_ptr, count, col_offset, row_width, comp_width, offset + 1,
		             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		return;
	}
	// Recurse
	idx_t radix_count = locations[0];
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		const idx_t loc = (locations[radix] - radix_count) * row_width;
		if (radix_count > SortConstants::INSERTION_SORT_THRESHOLD) {
			RadixSortMSD(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		} else if (radix_count != 0) {
			InsertionSort(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			              swap);
		}
		radix_count = locations[radix + 1] - locations[radix];
	}
}